

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O2

size_t fl_strlcat(char *dst,char *src,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  
  sVar1 = strlen(dst);
  __n = ~sVar1 + size;
  if (__n != 0) {
    sVar2 = strlen(src);
    if (sVar2 < __n) {
      __n = sVar2;
    }
    memcpy(dst + sVar1,src,__n);
    sVar1 = sVar1 + __n;
    dst[sVar1] = '\0';
  }
  return sVar1;
}

Assistant:

size_t				/* O - Length of string */
fl_strlcat(char       *dst,	/* O - Destination string */
           const char *src,	/* I - Source string */
	   size_t     size) {	/* I - Size of destination string buffer */
  size_t	srclen;		/* Length of source string */
  size_t	dstlen;		/* Length of destination string */


 /*
  * Figure out how much room is left...
  */

  dstlen = strlen(dst);
  size   -= dstlen + 1;

  if (!size) return (dstlen);	/* No room, return immediately... */

 /*
  * Figure out how much room is needed...
  */

  srclen = strlen(src);

 /*
  * Copy the appropriate amount...
  */

  if (srclen > size) srclen = size;

  memcpy(dst + dstlen, src, srclen);
  dst[dstlen + srclen] = '\0';

  return (dstlen + srclen);
}